

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

void __thiscall otherEqUnits_Richter_Test::TestBody(otherEqUnits_Richter_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_R9;
  double __value;
  double dVar4;
  double val1;
  precise_unit pVar5;
  AssertHelper local_160;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  precise_unit local_130;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  double conv7;
  Message local_a8;
  precise_unit local_a0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  AssertHelper local_60;
  Message local_58 [3];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  double conv5;
  otherEqUnits_Richter_Test *this_local;
  
  join_0x00000000_0x00001200_ =
       units::precise_unit::operator*
                 ((precise_unit *)units::precise::N,(precise_unit *)units::precise::m);
  __value = units::convert<units::precise_unit,units::precise_unit>
                      (5.0,(precise_unit *)units::precise::special::moment_magnitude,
                       (precise_unit *)&gtest_ar_.message_);
  iVar2 = std::isnan(__value);
  local_39 = (bool)((byte)iVar2 ^ 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_38,
               (AssertionResult *)"std::isnan(conv5)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x228,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  pVar5 = units::precise_unit::operator*
                    ((precise_unit *)units::precise::N,(precise_unit *)units::precise::m);
  local_a0._8_8_ = pVar5._8_8_;
  local_a0.multiplier_ = pVar5.multiplier_;
  dVar4 = units::convert<units::precise_unit,units::precise_unit>
                    (__value,&local_a0,(precise_unit *)units::precise::special::moment_magnitude);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_90,
             "convert( conv5, precise::N * precise::m, precise::special::moment_magnitude)","5.0",
             "0.0001",dVar4,5.0,0.0001);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&conv7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x22e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&conv7,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&conv7);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  join_0x00000000_0x00001200_ =
       units::precise_unit::operator*
                 ((precise_unit *)units::precise::N,(precise_unit *)units::precise::m);
  dVar4 = units::convert<units::precise_unit,units::precise_unit>
                    (7.0,(precise_unit *)units::precise::special::moment_magnitude,
                     (precise_unit *)&gtest_ar__1.message_);
  iVar2 = std::isnan(dVar4);
  local_d9 = (bool)((byte)iVar2 ^ 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_d8,
               (AssertionResult *)"std::isnan(conv7)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x232,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  pVar5 = units::precise_unit::operator*
                    ((precise_unit *)units::precise::N,(precise_unit *)units::precise::m);
  local_130._8_8_ = pVar5._8_8_;
  local_130.multiplier_ = pVar5.multiplier_;
  val1 = units::convert<units::precise_unit,units::precise_unit>
                   (dVar4,&local_130,(precise_unit *)units::precise::special::moment_magnitude);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_120,
             "convert( conv7, precise::N * precise::m, precise::special::moment_magnitude)","7.0",
             "0.0001",val1,7.0,0.0001);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x238,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_150,"conv7 / conv5","1000.0","10.0",dVar4 / __value,1000.0,10.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  return;
}

Assistant:

TEST(otherEqUnits, Richter)
{
    auto conv5 = convert(
        5.0, precise::special::moment_magnitude, precise::N * precise::m);
    EXPECT_FALSE(std::isnan(conv5));

    EXPECT_NEAR(
        convert(
            conv5, precise::N * precise::m, precise::special::moment_magnitude),
        5.0,
        0.0001);

    auto conv7 = convert(
        7.0, precise::special::moment_magnitude, precise::N * precise::m);
    EXPECT_FALSE(std::isnan(conv7));

    EXPECT_NEAR(
        convert(
            conv7, precise::N * precise::m, precise::special::moment_magnitude),
        7.0,
        0.0001);

    EXPECT_NEAR(conv7 / conv5, 1000.0, 10.0);
}